

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

string_view __thiscall wabt::ObjdumpNames::Get(ObjdumpNames *this,Index index)

{
  pointer pbVar1;
  ulong uVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  string_view sVar5;
  
  uVar2 = (ulong)index;
  pbVar1 = (this->names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var3._M_p = (pointer)0x0;
  sVar4 = 0;
  if (uVar2 < (ulong)((long)(this->names).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    _Var3._M_p = pbVar1[uVar2]._M_dataplus._M_p;
    sVar4 = pbVar1[uVar2]._M_string_length;
  }
  sVar5.size_ = sVar4;
  sVar5.data_ = _Var3._M_p;
  return sVar5;
}

Assistant:

string_view ObjdumpNames::Get(Index index) const {
  return index < names.size() ? names[index] : string_view();
}